

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidityTests.cpp
# Opt level: O1

bool ValidityTests::nearlyEqual(double a,double b,double epsilon)

{
  double dVar1;
  double dVar2;
  
  if ((a == b) && (!NAN(a) && !NAN(b))) {
    return true;
  }
  dVar2 = ABS(a - b);
  if (((a == 0.0) && (!NAN(a))) ||
     (((b == 0.0 && (!NAN(b))) || (dVar1 = ABS(a) + ABS(b), dVar1 < 2.2250738585072014e-308)))) {
    epsilon = epsilon * 2.2250738585072014e-308;
  }
  else {
    if (1.79769313486232e+308 <= dVar1) {
      dVar1 = 1.79769313486232e+308;
    }
    dVar2 = dVar2 / dVar1;
  }
  return dVar2 < epsilon;
}

Assistant:

bool ValidityTests::nearlyEqual(double a, double b, double epsilon) {
  // Handles cases of equality statements for floats
  if (a == b) {  // shortcut, handles infinities
    return true;
  }
  double absA = fabs(a);
  double absB = fabs(b);
  double diff = fabs(a - b);

  if (a == 0 || b == 0 || (absA + absB < DBL_MIN)) {
    // a or b is zero or both are extremely close to it
    // relative error is less meaningful here
    return diff < (epsilon * DBL_MIN);
  }  // use relative error
  return diff / fmin((absA + absB), DBL_MAX) < epsilon;
}